

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtriangulator.cpp
# Opt level: O0

bool __thiscall
QTriangulator<unsigned_int>::SimpleToMonotone::pointIsInSector
          (SimpleToMonotone *this,int vertex,int sector)

{
  bool bVar1;
  Edge *pEVar2;
  QPodPoint *other;
  QPodPoint *pQVar3;
  int in_EDX;
  int in_ESI;
  undefined8 *in_RDI;
  QPodPoint *v3;
  QPodPoint *v1;
  QPodPoint *p;
  int previous;
  int next;
  QPodPoint *center;
  QPodPoint *in_stack_ffffffffffffff78;
  QDataBuffer<QPodPoint> *pQVar4;
  QDataBuffer<QPodPoint> *this_00;
  QDataBuffer<QPodPoint> *this_01;
  SimpleToMonotone *this_02;
  int local_28;
  int local_24;
  int local_14;
  bool local_1;
  
  pQVar4 = (QDataBuffer<QPodPoint> *)*in_RDI;
  pEVar2 = QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge>::at
                     ((QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge> *)
                      (in_RDI + 3),(long)in_EDX);
  other = QDataBuffer<QPodPoint>::at(pQVar4,(ulong)pEVar2->from);
  local_14 = in_ESI;
  while( true ) {
    pQVar4 = (QDataBuffer<QPodPoint> *)*in_RDI;
    pEVar2 = QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge>::at
                       ((QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge> *)
                        (in_RDI + 3),(long)local_14);
    pQVar3 = QDataBuffer<QPodPoint>::at(pQVar4,(ulong)pEVar2->from);
    bVar1 = QPodPoint::operator==(pQVar3,other);
    if (!bVar1) break;
    pEVar2 = QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge>::at
                       ((QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge> *)
                        (in_RDI + 3),(long)local_14);
    local_14 = pEVar2->next;
  }
  pEVar2 = QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge>::at
                     ((QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge> *)
                      (in_RDI + 3),(long)in_EDX);
  local_24 = pEVar2->next;
  while( true ) {
    pQVar4 = (QDataBuffer<QPodPoint> *)*in_RDI;
    pEVar2 = QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge>::at
                       ((QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge> *)
                        (in_RDI + 3),(long)local_24);
    pQVar3 = QDataBuffer<QPodPoint>::at(pQVar4,(ulong)pEVar2->from);
    bVar1 = QPodPoint::operator==(pQVar3,other);
    if (!bVar1) break;
    pEVar2 = QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge>::at
                       ((QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge> *)
                        (in_RDI + 3),(long)local_24);
    local_24 = pEVar2->next;
  }
  pEVar2 = QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge>::at
                     ((QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge> *)
                      (in_RDI + 3),(long)in_EDX);
  local_28 = pEVar2->previous;
  while( true ) {
    this_02 = (SimpleToMonotone *)*in_RDI;
    pEVar2 = QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge>::at
                       ((QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge> *)
                        (in_RDI + 3),(long)local_28);
    pQVar3 = QDataBuffer<QPodPoint>::at((QDataBuffer<QPodPoint> *)this_02,(ulong)pEVar2->from);
    bVar1 = QPodPoint::operator==(pQVar3,other);
    if (!bVar1) break;
    pEVar2 = QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge>::at
                       ((QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge> *)
                        (in_RDI + 3),(long)local_28);
    local_28 = pEVar2->previous;
  }
  pQVar4 = (QDataBuffer<QPodPoint> *)*in_RDI;
  pEVar2 = QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge>::at
                     ((QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge> *)
                      (in_RDI + 3),(long)local_14);
  QDataBuffer<QPodPoint>::at(pQVar4,(ulong)pEVar2->from);
  this_00 = (QDataBuffer<QPodPoint> *)*in_RDI;
  pEVar2 = QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge>::at
                     ((QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge> *)
                      (in_RDI + 3),(long)local_28);
  QDataBuffer<QPodPoint>::at(this_00,(ulong)pEVar2->from);
  this_01 = (QDataBuffer<QPodPoint> *)*in_RDI;
  pEVar2 = QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge>::at
                     ((QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge> *)
                      (in_RDI + 3),(long)local_24);
  QDataBuffer<QPodPoint>::at(this_01,(ulong)pEVar2->from);
  if ((*(byte *)(in_RDI + 9) & 1) == 0) {
    local_1 = pointIsInSector(this_02,(QPodPoint *)this_01,(QPodPoint *)this_00,(QPodPoint *)pQVar4,
                              in_stack_ffffffffffffff78);
  }
  else {
    local_1 = pointIsInSector(this_02,(QPodPoint *)this_01,(QPodPoint *)this_00,(QPodPoint *)pQVar4,
                              in_stack_ffffffffffffff78);
  }
  return local_1;
}

Assistant:

bool QTriangulator<T>::SimpleToMonotone::pointIsInSector(int vertex, int sector)
{
    const QPodPoint &center = m_parent->m_vertices.at(m_edges.at(sector).from);
    // Handle degenerate edges.
    while (m_parent->m_vertices.at(m_edges.at(vertex).from) == center)
        vertex = m_edges.at(vertex).next;
    int next = m_edges.at(sector).next;
    while (m_parent->m_vertices.at(m_edges.at(next).from) == center)
        next = m_edges.at(next).next;
    int previous = m_edges.at(sector).previous;
    while (m_parent->m_vertices.at(m_edges.at(previous).from) == center)
        previous = m_edges.at(previous).previous;

    const QPodPoint &p = m_parent->m_vertices.at(m_edges.at(vertex).from);
    const QPodPoint &v1 = m_parent->m_vertices.at(m_edges.at(previous).from);
    const QPodPoint &v3 = m_parent->m_vertices.at(m_edges.at(next).from);
    if (m_clockwiseOrder)
        return pointIsInSector(p, v3, center, v1);
    else
        return pointIsInSector(p, v1, center, v3);
}